

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD3Importer::ValidateSurfaceHeaderOffsets(MD3Importer *this,Surface *pcSurf)

{
  int iVar1;
  Logger *pLVar2;
  runtime_error *this_00;
  ulong uVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (int)pcSurf - *(int *)&this->mBuffer;
  uVar3 = (ulong)this->fileSize;
  if ((((uVar3 < (ulong)(pcSurf->OFS_TRIANGLES + iVar1) + (ulong)pcSurf->NUM_TRIANGLES * 0xc) ||
       (uVar3 < (ulong)pcSurf->NUM_SHADER * 0x44 + (ulong)(pcSurf->OFS_SHADERS + iVar1))) ||
      (uVar3 < (ulong)(pcSurf->OFS_ST + iVar1) + (ulong)pcSurf->NUM_VERTICES * 8)) ||
     (uVar3 < (ulong)(iVar1 + pcSurf->OFS_XYZNORMAL) + (ulong)pcSurf->NUM_VERTICES * 8)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Invalid MD3 surface header: some offsets are outside the file",""
              );
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_007fd498;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x2000 < pcSurf->NUM_TRIANGLES) {
    pLVar2 = DefaultLogger::get();
    Logger::warn(pLVar2,"MD3: Quake III triangle limit exceeded");
  }
  if (0x100 < pcSurf->NUM_SHADER) {
    pLVar2 = DefaultLogger::get();
    Logger::warn(pLVar2,"MD3: Quake III shader limit exceeded");
  }
  if (0x1000 < pcSurf->NUM_VERTICES) {
    pLVar2 = DefaultLogger::get();
    Logger::warn(pLVar2,"MD3: Quake III vertex limit exceeded");
  }
  if (0x400 < pcSurf->NUM_FRAMES) {
    pLVar2 = DefaultLogger::get();
    Logger::warn(pLVar2,"MD3: Quake III frame limit exceeded");
    return;
  }
  return;
}

Assistant:

void MD3Importer::ValidateSurfaceHeaderOffsets(const MD3::Surface* pcSurf)
{
    // Calculate the relative offset of the surface
    const int32_t ofs = int32_t((const unsigned char*)pcSurf-this->mBuffer);

    // Check whether all data chunks are inside the valid range
    if (pcSurf->OFS_TRIANGLES + ofs + pcSurf->NUM_TRIANGLES * sizeof(MD3::Triangle) > fileSize  ||
        pcSurf->OFS_SHADERS + ofs + pcSurf->NUM_SHADER * sizeof(MD3::Shader) > fileSize         ||
        pcSurf->OFS_ST + ofs + pcSurf->NUM_VERTICES * sizeof(MD3::TexCoord) > fileSize          ||
        pcSurf->OFS_XYZNORMAL + ofs + pcSurf->NUM_VERTICES * sizeof(MD3::Vertex) > fileSize)    {

        throw DeadlyImportError("Invalid MD3 surface header: some offsets are outside the file");
    }

    // Check whether all requirements for Q3 files are met. We don't
    // care, but probably someone does.
    if (pcSurf->NUM_TRIANGLES > AI_MD3_MAX_TRIANGLES) {
        ASSIMP_LOG_WARN("MD3: Quake III triangle limit exceeded");
    }

    if (pcSurf->NUM_SHADER > AI_MD3_MAX_SHADERS) {
        ASSIMP_LOG_WARN("MD3: Quake III shader limit exceeded");
    }

    if (pcSurf->NUM_VERTICES > AI_MD3_MAX_VERTS) {
        ASSIMP_LOG_WARN("MD3: Quake III vertex limit exceeded");
    }

    if (pcSurf->NUM_FRAMES > AI_MD3_MAX_FRAMES) {
        ASSIMP_LOG_WARN("MD3: Quake III frame limit exceeded");
    }
}